

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O2

ostream * Kraken::operator<<(ostream *os,KTrade *kt)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<(os,'\"');
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,"\",\"");
  poVar3 = std::operator<<(poVar3,(char)kt->order);
  poVar3 = std::operator<<(poVar3,"\",\"");
  poVar3 = std::operator<<(poVar3,(char)kt->otype);
  poVar3 = std::operator<<(poVar3,"\",\"");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 5;
  poVar3 = std::ostream::_M_insert<double>(kt->price);
  poVar3 = std::operator<<(poVar3,"\",\"");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 9;
  poVar3 = std::ostream::_M_insert<double>(kt->volume);
  poVar3 = std::operator<<(poVar3,'\"');
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const KTrade& kt)
{
   return os << '"' << kt.time << "\",\""
	     << static_cast<char>(kt.order) << "\",\""
	     << static_cast<char>(kt.otype) << "\",\""
	     << std::fixed
	     << std::setprecision(5) << kt.price << "\",\""
	     << std::setprecision(9) << kt.volume << '"';
}